

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError DisposeDeviceInfos(PaUtilHostApiRepresentation *hostApi,void *scanResults,int deviceCount)

{
  PaAlsaHostApiRepresentation *alsaHostApi;
  
  if (scanResults != (void *)0x0) {
    if (*scanResults != (PaDeviceInfo **)0x0) {
      FreeDeviceInfos((PaUtilAllocationGroup *)hostApi[3].privatePaFrontInfo.baseDeviceIndex,
                      *scanResults,deviceCount);
      *(undefined8 *)scanResults = 0;
    }
    PaUtil_GroupFreeMemory
              ((PaUtilAllocationGroup *)hostApi[3].privatePaFrontInfo.baseDeviceIndex,scanResults);
  }
  return 0;
}

Assistant:

static PaError DisposeDeviceInfos(struct PaUtilHostApiRepresentation *hostApi, void *scanResults, int deviceCount)
{
    PaAlsaHostApiRepresentation *alsaHostApi = (PaAlsaHostApiRepresentation*)hostApi;

    if( scanResults != NULL )
    {
        PaLinuxScanDeviceInfosResults *scanDeviceInfosResults = ( PaLinuxScanDeviceInfosResults * ) scanResults;
        if( scanDeviceInfosResults->deviceInfos )
        {
            FreeDeviceInfos( alsaHostApi->allocations, scanDeviceInfosResults->deviceInfos, deviceCount );
            scanDeviceInfosResults->deviceInfos = NULL;
        }

        PaUtil_GroupFreeMemory(alsaHostApi->allocations, scanDeviceInfosResults );
    }

    return paNoError;
}